

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O3

menu_conflict * menu_dynamic_new(void)

{
  menu_conflict *m;
  
  m = (menu_conflict *)mem_alloc(0xb0);
  memset(m,0,0xb0);
  m->row_funcs = &dynamic_iter;
  m->skin = &menu_skin_scroll;
  m->count = 0;
  menu_ensure_cursor_valid(m);
  return m;
}

Assistant:

struct menu *menu_new(skin_id id, const menu_iter *iter)
{
	struct menu *m = mem_alloc(sizeof *m);
	menu_init(m, id, iter);
	return m;
}